

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int exprVectorRegister(Parse *pParse,Expr *pVector,int iField,int regSelect,Expr **ppExpr,
                      int *pRegFree)

{
  u8 uVar1;
  Expr *pEVar2;
  u8 op;
  int *pRegFree_local;
  Expr **ppExpr_local;
  int regSelect_local;
  int iField_local;
  Expr *pVector_local;
  Parse *pParse_local;
  
  uVar1 = pVector->op;
  if (uVar1 == 0xb0) {
    pEVar2 = sqlite3VectorFieldSubexpr(pVector,iField);
    *ppExpr = pEVar2;
    pParse_local._4_4_ = pVector->iTable + iField;
  }
  else if (uVar1 == 0x8a) {
    *ppExpr = ((pVector->x).pSelect)->pEList->a[iField].pExpr;
    pParse_local._4_4_ = regSelect + iField;
  }
  else if (uVar1 == 0xb1) {
    *ppExpr = ((pVector->x).pList)->a[iField].pExpr;
    pParse_local._4_4_ = sqlite3ExprCodeTemp(pParse,*ppExpr,pRegFree);
  }
  else {
    pParse_local._4_4_ = 0;
  }
  return pParse_local._4_4_;
}

Assistant:

static int exprVectorRegister(
  Parse *pParse,                  /* Parse context */
  Expr *pVector,                  /* Vector to extract element from */
  int iField,                     /* Field to extract from pVector */
  int regSelect,                  /* First in array of registers */
  Expr **ppExpr,                  /* OUT: Expression element */
  int *pRegFree                   /* OUT: Temp register to free */
){
  u8 op = pVector->op;
  assert( op==TK_VECTOR || op==TK_REGISTER || op==TK_SELECT || op==TK_ERROR );
  if( op==TK_REGISTER ){
    *ppExpr = sqlite3VectorFieldSubexpr(pVector, iField);
    return pVector->iTable+iField;
  }
  if( op==TK_SELECT ){
    assert( ExprUseXSelect(pVector) );
    *ppExpr = pVector->x.pSelect->pEList->a[iField].pExpr;
     return regSelect+iField;
  }
  if( op==TK_VECTOR ){
    assert( ExprUseXList(pVector) );
    *ppExpr = pVector->x.pList->a[iField].pExpr;
    return sqlite3ExprCodeTemp(pParse, *ppExpr, pRegFree);
  }
  return 0;
}